

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void linenoiseEditHistoryNext(linenoiseState *l,int dir)

{
  int iVar1;
  char **ppcVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  
  ppcVar2 = history;
  iVar1 = history_len;
  if (1 < history_len) {
    free(history[~l->history_index + history_len]);
    pcVar4 = strdup(l->buf);
    uVar3 = l->history_index;
    ppcVar2[(int)(~uVar3 + iVar1)] = pcVar4;
    uVar3 = (uint)(dir == 1) * 2 + -1 + uVar3;
    l->history_index = uVar3;
    if ((int)uVar3 < 0) {
      l->history_index = 0;
    }
    else {
      if (uVar3 < (uint)iVar1) {
        strncpy(l->buf,ppcVar2[(int)(iVar1 + ~uVar3)],l->buflen);
        l->buf[l->buflen - 1] = '\0';
        sVar5 = strlen(l->buf);
        l->pos = sVar5;
        l->len = sVar5;
        linenoiseRefreshLine();
        return;
      }
      l->history_index = iVar1 + -1;
    }
  }
  return;
}

Assistant:

void linenoiseEditHistoryNext(struct linenoiseState *l, int dir) {
    if (history_len > 1) {
        /* Update the current history entry before to
         * overwrite it with the next one. */
        free(history[history_len - 1 - l->history_index]);
        history[history_len - 1 - l->history_index] = strdup(l->buf);
        /* Show the new entry */
        l->history_index += (dir == LINENOISE_HISTORY_PREV) ? 1 : -1;
        if (l->history_index < 0) {
            l->history_index = 0;
            return;
        } else if (l->history_index >= history_len) {
            l->history_index = history_len-1;
            return;
        }
        strncpy(l->buf,history[history_len - 1 - l->history_index],l->buflen);
        l->buf[l->buflen-1] = '\0';
        l->len = l->pos = strlen(l->buf);
        linenoiseRefreshLine();
    }
}